

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void av1_rd_pick_intra_mode_sb
               (AV1_COMP *cpi,macroblock *x,RD_STATS *rd_cost,BLOCK_SIZE bsize,
               PICK_MODE_CONTEXT *ctx,int64_t best_rd)

{
  long lVar1;
  CFL_ALLOWED_TYPE CVar2;
  uint8_t ref_frame_type;
  int iVar3;
  uint uVar4;
  int iVar5;
  int64_t iVar6;
  byte in_CL;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  AV1_COMMON *in_R8;
  MACROBLOCK *in_R9;
  TX_SIZE max_uv_tx_size;
  int64_t intra_yrd;
  int64_t dist_uv;
  int64_t dist_y;
  uint8_t uv_skip_txfm;
  uint8_t y_skip_txfm;
  int rate_uv_tokenonly;
  int rate_y_tokenonly;
  int rate_uv;
  int rate_y;
  TxfmSearchInfo *txfm_info;
  int num_planes;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  uint8_t *in_stack_00000128;
  int64_t *in_stack_00000130;
  int *in_stack_00000138;
  int *in_stack_00000140;
  MACROBLOCK *in_stack_00000148;
  AV1_COMP *in_stack_00000150;
  BLOCK_SIZE in_stack_00000170;
  TX_SIZE in_stack_00000178;
  uint8_t *in_stack_00000560;
  int64_t *in_stack_00000568;
  int *in_stack_00000570;
  int *in_stack_00000578;
  MACROBLOCK *in_stack_00000580;
  AV1_COMP *in_stack_00000588;
  BLOCK_SIZE in_stack_000005d0;
  int64_t in_stack_000005d8;
  PICK_MODE_CONTEXT *in_stack_000005e0;
  int64_t in_stack_00000af8;
  BLOCK_SIZE in_stack_00000b07;
  RD_STATS *in_stack_00000b08;
  PICK_MODE_CONTEXT *in_stack_00000b10;
  MACROBLOCK *in_stack_00000b18;
  AV1_COMP *in_stack_00000b20;
  undefined4 in_stack_ffffffffffffff3c;
  MACROBLOCK *x_00;
  AV1_COMMON *cm_00;
  int in_stack_ffffffffffffff50;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_best;
  undefined4 in_stack_ffffffffffffff64;
  MODE_EVAL_TYPE mode_eval_type;
  MACROBLOCK *in_stack_ffffffffffffff68;
  long lVar7;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  MACROBLOCK *local_30;
  
  mode_eval_type = (MODE_EVAL_TYPE)((uint)in_stack_ffffffffffffff64 >> 0x18);
  lVar1 = **(long **)(in_RSI + 0x2058);
  iVar3 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  *(undefined1 *)(in_R8->ref_frame_map + 5) = 0;
  *(undefined1 *)(lVar1 + 0x10) = 0;
  *(undefined1 *)(lVar1 + 0x11) = 0xff;
  *(ushort *)(lVar1 + 0xa7) = *(ushort *)(lVar1 + 0xa7) & 0xff7f;
  *(undefined4 *)(lVar1 + 8) = 0;
  *(ushort *)(lVar1 + 0xa7) = *(ushort *)(lVar1 + 0xa7) & 0xffbf;
  uVar4 = (uint)in_CL;
  x_00 = in_R9;
  cm_00 = in_R8;
  iVar6 = av1_rd_pick_intra_sby_mode
                    (in_stack_00000588,in_stack_00000580,in_stack_00000578,in_stack_00000570,
                     in_stack_00000568,in_stack_00000560,in_stack_000005d0,in_stack_000005d8,
                     in_stack_000005e0);
  set_mode_eval_params
            ((AV1_COMP *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,mode_eval_type);
  if (iVar6 < (long)in_R9) {
    if (1 < iVar3) {
      if (((*(byte *)(in_RSI + 0x1ac) & 1) != 0) &&
         (CVar2 = store_cfl_required_rdo(cm_00,x_00), CVar2 != '\0')) {
        memcpy((void *)(in_RSI + 0x24e09),*(void **)&(in_R8->sf_identity).x_step_q4,
               (long)*(int *)in_R8->ref_frame_map);
        memcpy(*(void **)(in_RSI + 0x2088),*(void **)&in_R8->ref_scale_factors[7].x_step_q4,
               (long)*(int *)in_R8->ref_frame_map);
      }
      av1_get_tx_size(in_stack_ffffffffffffff50,(MACROBLOCKD *)cm_00);
      uVar4 = (uint)in_CL;
      av1_rd_pick_intra_sbuv_mode
                (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138,
                 in_stack_00000130,in_stack_00000128,in_stack_00000170,in_stack_00000178);
    }
    iVar3 = 0;
    lVar7 = in_RSI;
    iVar5 = av1_get_skip_txfm_context((MACROBLOCKD *)(in_RSI + 0x1a0));
    *in_RDX = iVar3 + *(int *)(lVar7 + 0x8c80 + (long)iVar5 * 8);
    in_RDX[2] = 0;
    in_RDX[3] = 0;
    *(long *)(in_RDX + 4) =
         ((long)*in_RDX * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
         *(long *)(in_RDX + 2) * 0x80;
    *(undefined1 *)(in_RDX + 8) = 0;
  }
  else {
    *in_RDX = 0x7fffffff;
  }
  local_30 = in_R9;
  if ((*in_RDX != 0x7fffffff) && (*(long *)(in_RDX + 4) < (long)in_R9)) {
    local_30 = *(MACROBLOCK **)(in_RDX + 4);
  }
  iVar6 = rd_pick_intrabc_mode_sb
                    (in_stack_00000b20,in_stack_00000b18,in_stack_00000b10,in_stack_00000b08,
                     in_stack_00000b07,in_stack_00000af8);
  if (iVar6 < (long)local_30) {
    *(undefined1 *)(in_R8->ref_frame_map + 5) = *(undefined1 *)(lVar1 + 0x90);
    memcpy(*(void **)&(in_R8->sf_identity).x_step_q4,(void *)(in_RSI + 0x24e09),
           (long)*(int *)in_R8->ref_frame_map);
  }
  if (*in_RDX != 0x7fffffff) {
    memcpy(in_R8,(void *)**(undefined8 **)(in_RSI + 0x2058),0xb0);
    mbmi_ext_best = (MB_MODE_INFO_EXT_FRAME *)(in_R8->buffer_removal_times + 0x17);
    ref_frame_type =
         av1_ref_frame_type((MV_REFERENCE_FRAME *)CONCAT44(in_stack_ffffffffffffff3c,uVar4));
    av1_copy_mbmi_ext_to_mbmi_ext_frame
              (mbmi_ext_best,(MB_MODE_INFO_EXT *)(in_RSI + 0x3c70),ref_frame_type);
    memcpy(*(void **)&in_R8->ref_scale_factors[7].x_step_q4,*(void **)(in_RSI + 0x2088),
           (long)*(int *)in_R8->ref_frame_map);
  }
  return;
}

Assistant:

void av1_rd_pick_intra_mode_sb(const struct AV1_COMP *cpi, struct macroblock *x,
                               struct RD_STATS *rd_cost, BLOCK_SIZE bsize,
                               PICK_MODE_CONTEXT *ctx, int64_t best_rd) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int num_planes = av1_num_planes(cm);
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  int rate_y = 0, rate_uv = 0, rate_y_tokenonly = 0, rate_uv_tokenonly = 0;
  uint8_t y_skip_txfm = 0, uv_skip_txfm = 0;
  int64_t dist_y = 0, dist_uv = 0;

  ctx->rd_stats.skip_txfm = 0;
  mbmi->ref_frame[0] = INTRA_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  mbmi->use_intrabc = 0;
  mbmi->mv[0].as_int = 0;
  mbmi->skip_mode = 0;

  const int64_t intra_yrd =
      av1_rd_pick_intra_sby_mode(cpi, x, &rate_y, &rate_y_tokenonly, &dist_y,
                                 &y_skip_txfm, bsize, best_rd, ctx);

  // Initialize default mode evaluation params
  set_mode_eval_params(cpi, x, DEFAULT_EVAL);

  if (intra_yrd < best_rd) {
    // Search intra modes for uv planes if needed
    if (num_planes > 1) {
      // Set up the tx variables for reproducing the y predictions in case we
      // need it for chroma-from-luma.
      if (xd->is_chroma_ref && store_cfl_required_rdo(cm, x)) {
        memcpy(txfm_info->blk_skip, ctx->blk_skip,
               sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
        av1_copy_array(xd->tx_type_map, ctx->tx_type_map, ctx->num_4x4_blk);
      }
      const TX_SIZE max_uv_tx_size = av1_get_tx_size(AOM_PLANE_U, xd);
      av1_rd_pick_intra_sbuv_mode(cpi, x, &rate_uv, &rate_uv_tokenonly,
                                  &dist_uv, &uv_skip_txfm, bsize,
                                  max_uv_tx_size);
    }

    // Intra block is always coded as non-skip
    rd_cost->rate =
        rate_y + rate_uv +
        x->mode_costs.skip_txfm_cost[av1_get_skip_txfm_context(xd)][0];
    rd_cost->dist = dist_y + dist_uv;
    rd_cost->rdcost = RDCOST(x->rdmult, rd_cost->rate, rd_cost->dist);
    rd_cost->skip_txfm = 0;
  } else {
    rd_cost->rate = INT_MAX;
  }

  if (rd_cost->rate != INT_MAX && rd_cost->rdcost < best_rd)
    best_rd = rd_cost->rdcost;
  if (rd_pick_intrabc_mode_sb(cpi, x, ctx, rd_cost, bsize, best_rd) < best_rd) {
    ctx->rd_stats.skip_txfm = mbmi->skip_txfm;
    memcpy(ctx->blk_skip, txfm_info->blk_skip,
           sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
    assert(rd_cost->rate != INT_MAX);
  }
  if (rd_cost->rate == INT_MAX) return;

  ctx->mic = *xd->mi[0];
  av1_copy_mbmi_ext_to_mbmi_ext_frame(&ctx->mbmi_ext_best, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
  av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
}